

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

void __thiscall wasm::WasmBinaryWriter::writeImports(WasmBinaryWriter *this)

{
  BufferWithRandomAccess *this_00;
  Index value;
  int32_t start_00;
  pointer this_01;
  anon_class_16_2_8016f8e4 visitor;
  anon_class_16_2_8016f8e4 visitor_00;
  anon_class_16_2_8016f8e4 visitor_01;
  anon_class_16_2_8016f8e4 visitor_02;
  anon_class_16_2_8016f8e4 visitor_03;
  undefined1 local_28 [8];
  anon_class_8_1_8991fb9c writeImportHeader;
  int32_t start;
  Index num;
  WasmBinaryWriter *this_local;
  
  this_01 = std::unique_ptr<wasm::ImportInfo,_std::default_delete<wasm::ImportInfo>_>::operator->
                      (&this->importInfo);
  value = ImportInfo::getNumImports(this_01);
  if (value != 0) {
    start_00 = startSection<wasm::BinaryConsts::Section>(this,Import);
    this_00 = this->o;
    LEB<unsigned_int,_unsigned_char>::LEB
              ((LEB<unsigned_int,_unsigned_char> *)((long)&writeImportHeader.this + 4),value);
    BufferWithRandomAccess::operator<<(this_00,writeImportHeader.this._4_4_);
    visitor.this = (WasmBinaryWriter *)local_28;
    visitor.writeImportHeader = (anon_class_8_1_8991fb9c *)this;
    local_28 = (undefined1  [8])this;
    wasm::ModuleUtils::iterImportedFunctions<wasm::WasmBinaryWriter::writeImports()::__0>
              ((ModuleUtils *)this->wasm,(Module *)local_28,visitor);
    visitor_00.this = (WasmBinaryWriter *)local_28;
    visitor_00.writeImportHeader = (anon_class_8_1_8991fb9c *)this;
    wasm::ModuleUtils::iterImportedGlobals<wasm::WasmBinaryWriter::writeImports()::__1>
              ((ModuleUtils *)this->wasm,(Module *)local_28,visitor_00);
    visitor_01.this = (WasmBinaryWriter *)local_28;
    visitor_01.writeImportHeader = (anon_class_8_1_8991fb9c *)this;
    wasm::ModuleUtils::iterImportedTags<wasm::WasmBinaryWriter::writeImports()::__2>
              ((ModuleUtils *)this->wasm,(Module *)local_28,visitor_01);
    visitor_02.this = (WasmBinaryWriter *)local_28;
    visitor_02.writeImportHeader = (anon_class_8_1_8991fb9c *)this;
    wasm::ModuleUtils::iterImportedMemories<wasm::WasmBinaryWriter::writeImports()::__3>
              ((ModuleUtils *)this->wasm,(Module *)local_28,visitor_02);
    visitor_03.this = (WasmBinaryWriter *)local_28;
    visitor_03.writeImportHeader = (anon_class_8_1_8991fb9c *)this;
    wasm::ModuleUtils::iterImportedTables<wasm::WasmBinaryWriter::writeImports()::__4>
              ((ModuleUtils *)this->wasm,(Module *)local_28,visitor_03);
    finishSection(this,start_00);
  }
  return;
}

Assistant:

void WasmBinaryWriter::writeImports() {
  auto num = importInfo->getNumImports();
  if (num == 0) {
    return;
  }
  auto start = startSection(BinaryConsts::Section::Import);
  o << U32LEB(num);
  auto writeImportHeader = [&](Importable* import) {
    writeInlineString(import->module.str);
    writeInlineString(import->base.str);
  };
  ModuleUtils::iterImportedFunctions(*wasm, [&](Function* func) {
    writeImportHeader(func);
    o << U32LEB(int32_t(ExternalKind::Function));
    o << U32LEB(getTypeIndex(func->type));
  });
  ModuleUtils::iterImportedGlobals(*wasm, [&](Global* global) {
    writeImportHeader(global);
    o << U32LEB(int32_t(ExternalKind::Global));
    writeType(global->type);
    o << U32LEB(global->mutable_);
  });
  ModuleUtils::iterImportedTags(*wasm, [&](Tag* tag) {
    writeImportHeader(tag);
    o << U32LEB(int32_t(ExternalKind::Tag));
    o << uint8_t(0); // Reserved 'attribute' field. Always 0.
    o << U32LEB(getTypeIndex(tag->type));
  });
  ModuleUtils::iterImportedMemories(*wasm, [&](Memory* memory) {
    writeImportHeader(memory);
    o << U32LEB(int32_t(ExternalKind::Memory));
    writeResizableLimits(memory->initial,
                         memory->max,
                         memory->hasMax(),
                         memory->shared,
                         memory->is64());
  });
  ModuleUtils::iterImportedTables(*wasm, [&](Table* table) {
    writeImportHeader(table);
    o << U32LEB(int32_t(ExternalKind::Table));
    writeType(table->type);
    writeResizableLimits(table->initial,
                         table->max,
                         table->hasMax(),
                         /*shared=*/false,
                         table->is64());
  });
  finishSection(start);
}